

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::InsertValueCompensation
          (GlobOpt *this,BasicBlock *predecessor,BasicBlock *successor,
          SymToValueInfoMap *symsRequiringCompensationToMergedValueInfoMap)

{
  ValueType VVar1;
  BasicBlock *pBVar2;
  JitArenaAllocator *alloc;
  code *pcVar3;
  int size;
  Type pDVar4;
  Type right;
  bool bVar5;
  BOOLEAN BVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar7;
  undefined4 *puVar8;
  Instr *pIVar9;
  EntryType *pEVar10;
  Value *pVVar11;
  ArrayValueInfo *pAVar12;
  RegOpnd *pRVar13;
  RegOpnd *pRVar14;
  Instr *pIVar15;
  Value *pVVar16;
  ValueInfo *pVVar17;
  Value *toDataVal;
  Type *dst;
  long lVar18;
  Func **ppFVar19;
  StackSym *pSVar20;
  StackSym *pSVar21;
  ValueType *pVVar22;
  ulong uVar23;
  StackSym *sym;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  undefined1 local_120 [8];
  EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  it;
  List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  local_e0;
  int32 local_ac;
  StackSym *pSStack_a8;
  int32 newBufferSize;
  StackSym *local_a0;
  StackSym *local_98;
  GlobOptBlockData *local_90;
  int32 local_88;
  uint local_84;
  GlobOptBlockData *local_80;
  StackSym *local_78;
  Instr *local_70;
  JitArenaAllocator *local_68;
  BasicBlock *local_60;
  GlobOpt *local_58;
  Func *local_50;
  StackSym *local_48;
  undefined4 *local_40;
  int32 local_38;
  bool local_31;
  int32 newLength;
  
  local_60 = predecessor;
  local_58 = this;
  if (predecessor == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49a,"(predecessor)","predecessor");
    if (!bVar5) goto LAB_0041bb3b;
    *puVar8 = 0;
  }
  if (successor == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49b,"(successor)","successor");
    if (!bVar5) goto LAB_0041bb3b;
    *puVar8 = 0;
  }
  if (local_60 == successor) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49c,"(predecessor != successor)","predecessor != successor");
    if (!bVar5) goto LAB_0041bb3b;
    *puVar8 = 0;
  }
  if (symsRequiringCompensationToMergedValueInfoMap->count ==
      symsRequiringCompensationToMergedValueInfoMap->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49d,"(symsRequiringCompensationToMergedValueInfoMap->Count() != 0)",
                       "symsRequiringCompensationToMergedValueInfoMap->Count() != 0");
    if (!bVar5) goto LAB_0041bb3b;
    *puVar8 = 0;
  }
  pBVar2 = local_60->next;
  ppFVar19 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar19 = &local_60->func;
  }
  lVar18 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar18 = 0xd0;
  }
  pIVar15 = *(Instr **)((long)&(*ppFVar19)->m_alloc + lVar18);
  local_31 = true;
  if ((local_58->field_0xf4 & 0x80) != 0) {
    local_31 = successor->dataUseCount != 0;
  }
  local_50 = pIVar15->m_func;
  if ((pIVar15->m_kind == InstrKindBranch) || (pIVar15->m_opcode == BailTarget)) {
    do {
      pIVar9 = pIVar15;
      pIVar15 = pIVar9->m_prev;
    } while (pIVar9->m_prev->m_opcode == ByteCodeUses);
  }
  else {
    pIVar9 = pIVar15->m_next;
    if (pIVar9 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4b2,"(insertBeforeInstr->m_next)","insertBeforeInstr->m_next");
      if (!bVar5) {
LAB_0041bb3b:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
      pIVar9 = pIVar15->m_next;
    }
  }
  local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       &local_58->alloc->super_ArenaAllocator;
  local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01371fb8;
  local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer
       = (Type *)0x0;
  local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.count =
       0;
  local_e0.length = 0;
  local_e0.increment = 4;
  local_70 = pIVar9;
  JsUtil::
  BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_120,symsRequiringCompensationToMergedValueInfoMap);
  local_80 = &local_60->globOptData;
  local_90 = &successor->globOptData;
  local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    bVar5 = JsUtil::
            BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)local_120);
    pDVar4 = local_e0.
             super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
             buffer;
    if (!bVar5) {
      uVar23 = 0;
      uVar25 = (ulong)(uint)local_e0.
                            super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                            .count;
      if (local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
          .count < 1) {
        uVar25 = uVar23;
      }
      for (; uVar25 * 0x10 != uVar23; uVar23 = uVar23 + 0x10) {
        ChangeValueInfo(local_58,local_60,*(Value **)((long)&pDVar4->predecessorValue + uVar23),
                        *(ValueInfo **)((long)&pDVar4->valueInfo + uVar23),false,true);
      }
      JsUtil::
      List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::~List(&local_e0);
      return;
    }
    pEVar10 = JsUtil::
              BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
              ::Current((IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                         *)local_120);
    pVVar11 = GlobOptBlockData::FindValue
                        (local_80,(pEVar10->
                                  super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                  ).super_KeyValueEntry<Sym_*,_ValueInfo_*>.
                                  super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
                                  .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.key);
    if (pVVar11 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4cd,"(predecessorValue)","predecessorValue");
      if (!bVar5) goto LAB_0041bb3b;
      *local_40 = 0;
    }
    pVVar17 = pVVar11->valueInfo;
    bVar5 = ValueType::IsAnyOptimizedArray(&pVVar17->super_ValueType);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4d1,"(predecessorValueInfo->IsAnyOptimizedArray())",
                         "predecessorValueInfo->IsAnyOptimizedArray()");
      if (!bVar5) goto LAB_0041bb3b;
      *local_40 = 0;
    }
    it.
    super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
    ._24_8_ = pVVar17;
    pAVar12 = ValueInfo::AsArrayValueInfo(pVVar17);
    pSVar20 = pAVar12->headSegmentSym;
    sym = pAVar12->headSegmentLengthSym;
    local_78 = pAVar12->lengthSym;
    pAVar12 = ValueInfo::AsArrayValueInfo
                        ((pEVar10->
                         super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         ).super_KeyValueEntry<Sym_*,_ValueInfo_*>.
                         super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
                         .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.value);
    local_a0 = pAVar12->headSegmentSym;
    local_48 = pAVar12->headSegmentLengthSym;
    pSVar21 = pAVar12->lengthSym;
    pSStack_a8 = pSVar20;
    if ((pSVar20 == (StackSym *)0x0) && (local_a0 != (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4db,"(!mergedHeadSegmentSym || predecessorHeadSegmentSym)",
                         "!mergedHeadSegmentSym || predecessorHeadSegmentSym");
      if (!bVar5) goto LAB_0041bb3b;
      *local_40 = 0;
    }
    if ((sym == (StackSym *)0x0) && (local_48 != (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4dc,"(!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym)",
                         "!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym");
      if (!bVar5) goto LAB_0041bb3b;
      *local_40 = 0;
    }
    if ((local_78 == (StackSym *)0x0) && (pSVar21 != (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4dd,"(!mergedLengthSym || predecessorLengthSym)",
                         "!mergedLengthSym || predecessorLengthSym");
      if (!bVar5) goto LAB_0041bb3b;
      *local_40 = 0;
    }
    bVar26 = local_a0 != (StackSym *)0x0;
    bVar5 = pSStack_a8 != local_a0;
    local_98 = pSVar21;
    if (bVar5 && bVar26) {
      pRVar13 = IR::RegOpnd::New(local_a0,local_a0->m_type,local_50);
      pRVar14 = IR::RegOpnd::New(pSStack_a8,pSStack_a8->m_type,local_50);
      pIVar15 = IR::Instr::New(Ld_A,&pRVar13->super_Opnd,&pRVar14->super_Opnd,local_50);
      IR::Opnd::SetIsJITOptimizedReg(pIVar15->m_dst,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar15->m_src1,true);
      IR::Instr::SetByteCodeOffset(pIVar15,local_70);
      IR::Instr::InsertBefore(local_70,pIVar15);
    }
    bVar5 = bVar5 && bVar26;
    if ((local_48 != (StackSym *)0x0) && (sym != local_48)) {
      pRVar13 = IR::RegOpnd::New(local_48,local_48->m_type,local_50);
      pRVar14 = IR::RegOpnd::New(sym,sym->m_type,local_50);
      pIVar15 = IR::Instr::New(Ld_A,&pRVar13->super_Opnd,&pRVar14->super_Opnd,local_50);
      IR::Opnd::SetIsJITOptimizedReg(pIVar15->m_dst,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar15->m_src1,true);
      IR::Instr::SetByteCodeOffset(pIVar15,local_70);
      IR::Instr::InsertBefore(local_70,pIVar15);
      BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((local_60->globOptData).liveVarSyms,(sym->super_Sym).m_id);
      if (BVar6 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x4fe,
                           "(predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id))"
                           ,
                           "predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id)"
                          );
        if (!bVar5) goto LAB_0041bb3b;
        *local_40 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                ((local_60->globOptData).liveVarSyms,(local_48->super_Sym).m_id);
      pVVar16 = GlobOptBlockData::FindValue(local_80,&sym->super_Sym);
      if (pVVar16 == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x502,"(predecessorHeadSegmentLengthValue)",
                           "predecessorHeadSegmentLengthValue");
        if (!bVar5) goto LAB_0041bb3b;
        *local_40 = 0;
      }
      GlobOptBlockData::SetValue(local_80,pVVar16,&local_48->super_Sym);
      bVar5 = true;
      if (local_31 != false) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((successor->globOptData).liveVarSyms,(local_48->super_Sym).m_id);
        local_68 = (JitArenaAllocator *)GlobOptBlockData::FindValue(local_90,&local_48->super_Sym);
        if (local_68 == (JitArenaAllocator *)0x0) {
          pVVar16 = CopyValue(local_58,pVVar16);
          GlobOptBlockData::SetValue(local_90,pVVar16,&local_48->super_Sym);
        }
        else {
          if (*(ValueNumber *)
               &(local_68->super_ArenaAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                super_Allocator.outOfMemoryFunc == pVVar16->valueNumber) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_40 = 1;
            bVar26 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                ,0x50b,
                                "(mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber())"
                                ,
                                "mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber()"
                               );
            if (!bVar26) goto LAB_0041bb3b;
            *local_40 = 0;
          }
          pVVar17 = (ValueInfo *)
                    (local_68->super_ArenaAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.recoverMemoryFunc;
          if (pVVar16->valueInfo != pVVar17) {
            alloc = local_58->alloc;
            VVar1.field_0 =
                 (anon_union_2_4_ea848c7b_for_ValueType_13)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(pVVar16->valueInfo->super_ValueType).field_0.field_0;
            ValueType::Verify((ValueType)
                              *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                               &(pVVar17->super_ValueType).field_0.field_0);
            ValueType::Verify(VVar1);
            pVVar22 = &pVVar17->super_ValueType;
            bVar26 = ValueType::operator==(pVVar22,VVar1);
            local_84 = (uint)(ushort)VVar1.field_0;
            if (bVar26) {
              aVar7.field_0 = (pVVar22->field_0).field_0;
            }
            else {
              ValueType::ValueType
                        ((ValueType *)&local_38,(pVVar22->field_0).bits | (ushort)VVar1.field_0);
              bVar26 = ValueType::OneOn((ValueType *)&local_38,Object);
              if (bVar26) {
                aVar7.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::MergeWithObject(pVVar22,SUB42(local_84,0));
              }
              else {
                aVar7.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(local_38._0_2_);
              }
            }
            pVVar17 = ValueInfo::MergeLikelyIntValueInfo
                                (alloc,(Value *)local_68,pVVar16,(ValueType)aVar7.field_0);
            ::Value::SetValueInfo((Value *)local_68,pVVar17);
          }
        }
      }
    }
    pSVar20 = local_98;
    if ((local_98 == (StackSym *)0x0) || (local_78 == local_98)) {
      if (bVar5) goto LAB_0041b882;
    }
    else {
      pRVar13 = IR::RegOpnd::New(local_98,local_98->m_type,local_50);
      pRVar14 = IR::RegOpnd::New(local_78,local_78->m_type,local_50);
      pIVar15 = IR::Instr::New(Ld_I4,&pRVar13->super_Opnd,&pRVar14->super_Opnd,local_50);
      IR::Opnd::SetIsJITOptimizedReg(pIVar15->m_dst,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar15->m_src1,true);
      IR::Instr::SetByteCodeOffset(pIVar15,local_70);
      IR::Instr::InsertBefore(local_70,pIVar15);
      BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((local_60->globOptData).liveVarSyms,(local_78->super_Sym).m_id);
      if (BVar6 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x52d,
                           "(predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id))",
                           "predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id)");
        if (!bVar5) goto LAB_0041bb3b;
        *local_40 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                ((local_60->globOptData).liveVarSyms,(pSVar20->super_Sym).m_id);
      pVVar16 = GlobOptBlockData::FindValue(local_80,&local_78->super_Sym);
      if (pVVar16 == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x530,"(predecessorLengthValue)","predecessorLengthValue");
        if (!bVar5) goto LAB_0041bb3b;
        *local_40 = 0;
      }
      GlobOptBlockData::SetValue(local_80,pVVar16,&pSVar20->super_Sym);
      pSVar20 = local_98;
      if (local_31 != false) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((successor->globOptData).liveVarSyms,(local_98->super_Sym).m_id);
        toDataVal = GlobOptBlockData::FindValue(local_90,&pSVar20->super_Sym);
        if (toDataVal == (Value *)0x0) {
          pVVar16 = CopyValue(local_58,pVVar16);
          GlobOptBlockData::SetValue(local_90,pVVar16,&local_98->super_Sym);
        }
        else {
          if (toDataVal->valueNumber == pVVar16->valueNumber) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_40 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x539,
                               "(mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber())"
                               ,
                               "mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber()"
                              );
            if (!bVar5) goto LAB_0041bb3b;
            *local_40 = 0;
          }
          pVVar17 = toDataVal->valueInfo;
          if (pVVar16->valueInfo != pVVar17) {
            local_68 = local_58->alloc;
            VVar1.field_0 =
                 (anon_union_2_4_ea848c7b_for_ValueType_13)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(pVVar16->valueInfo->super_ValueType).field_0.field_0;
            ValueType::Verify((ValueType)
                              *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                               &(pVVar17->super_ValueType).field_0.field_0);
            ValueType::Verify(VVar1);
            pVVar22 = &pVVar17->super_ValueType;
            bVar5 = ValueType::operator==(pVVar22,VVar1);
            if (bVar5) {
              aVar7.field_0 = (pVVar22->field_0).field_0;
            }
            else {
              ValueType::ValueType
                        ((ValueType *)&local_38,(pVVar22->field_0).bits | (ushort)VVar1.field_0);
              bVar5 = ValueType::OneOn((ValueType *)&local_38,Object);
              if (bVar5) {
                aVar7.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::MergeWithObject(pVVar22,VVar1);
              }
              else {
                aVar7.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(local_38._0_2_);
              }
            }
            pVVar17 = ValueInfo::MergeLikelyIntValueInfo
                                (local_68,toDataVal,pVVar16,(ValueType)aVar7.field_0);
            ::Value::SetValueInfo(toDataVal,pVVar17);
          }
        }
      }
LAB_0041b882:
      pSVar20 = pSStack_a8;
      if (local_a0 != (StackSym *)0x0) {
        pSVar20 = local_a0;
      }
      if (local_48 != (StackSym *)0x0) {
        sym = local_48;
      }
      pSVar21 = local_78;
      if (local_98 != (StackSym *)0x0) {
        pSVar21 = local_98;
      }
      pAVar12 = ArrayValueInfo::New(local_58->alloc,
                                    (ValueType)
                                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                     &((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                      (it.
                                       super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                                       ._24_8_ + 8))->field_0,pSVar20,sym,pSVar21,
                                    *(Sym **)(it.
                                              super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                                              ._24_8_ + 0x10));
      pDVar4 = local_e0.
               super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
               buffer;
      if (local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
          .buffer == (Type *)0x0) {
        size = local_e0.increment;
        if (local_e0.increment < 1) {
          size = 0;
        }
        local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
        buffer = JsUtil::
                 List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::AllocArray(&local_e0,size);
        local_e0.length = size;
        local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
        count = 0;
      }
      else {
        right = local_e0.length;
        lVar18 = (long)local_e0.length;
        if (local_e0.
            super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.count
            == local_e0.length || local_e0.length < 0) {
          local_48 = (StackSym *)
                     CONCAT44(local_48._4_4_,
                              local_e0.
                              super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                              .count);
          local_38 = 0;
          local_ac = 0;
          local_88 = 0;
          bVar5 = Int32Math::Add(local_e0.length,1,&local_38);
          if ((bVar5) || (bVar5 = Int32Math::Shl(local_38,1,&local_38), bVar5)) {
            JsUtil::ExternalApi::RaiseOnIntOverflow();
          }
          if (local_38 < 1) {
            local_38 = 0;
          }
          bVar5 = Int32Math::Mul(0x10,local_38,&local_ac);
          if ((bVar5) || (bVar5 = Int32Math::Mul(0x10,right,&local_88), bVar5)) {
            JsUtil::ExternalApi::RaiseOnIntOverflow();
          }
          dst = JsUtil::
                List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::AllocArray(&local_e0,local_38);
          lVar24 = (long)local_38;
          js_memcpy_s(dst,lVar24 << 4,pDVar4,lVar18 << 4);
          if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_0145c43c) == 1) {
            (*g_verifyIsNotBarrierAddress)(dst,lVar24);
          }
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (&(local_e0.
                       super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                      .alloc)->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                     pDVar4,(long)local_88);
          local_e0.length = local_38;
          local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
          .count = (uint)local_48;
          local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
          .buffer = dst;
        }
      }
      local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
      buffer[local_e0.
             super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.count
            ].predecessorValue = pVVar11;
      local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
      buffer[local_e0.
             super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.count
            ].valueInfo = pAVar12;
      local_e0.super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
      count = local_e0.
              super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
              count + 1;
    }
    JsUtil::
    BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_120);
  } while( true );
}

Assistant:

void GlobOpt::InsertValueCompensation(
    BasicBlock *const predecessor,
    BasicBlock *const successor,
    const SymToValueInfoMap *symsRequiringCompensationToMergedValueInfoMap)
{
    Assert(predecessor);
    Assert(successor);
    AssertOrFailFast(predecessor != successor);
    Assert(symsRequiringCompensationToMergedValueInfoMap->Count() != 0);

    IR::Instr *insertBeforeInstr = predecessor->GetLastInstr();
    Func *const func = insertBeforeInstr->m_func;
    bool setLastInstrInPredecessor;
    // If this is a loop back edge, and the successor has been completed, don't attempt to update its block data.
    // The update is unnecessary, and the data has likely been freed.
    bool updateSuccessorBlockData = !this->isPerformingLoopBackEdgeCompensation || successor->GetDataUseCount() > 0;

    if(insertBeforeInstr->IsBranchInstr() || insertBeforeInstr->m_opcode == Js::OpCode::BailTarget)
    {
        // Don't insert code between the branch and the corresponding ByteCodeUses instructions
        while(insertBeforeInstr->m_prev->m_opcode == Js::OpCode::ByteCodeUses)
        {
            insertBeforeInstr = insertBeforeInstr->m_prev;
        }
        setLastInstrInPredecessor = false;
    }
    else
    {
        // Insert at the end of the block and set the last instruction
        Assert(insertBeforeInstr->m_next);
        insertBeforeInstr = insertBeforeInstr->m_next; // Instruction after the last instruction in the predecessor
        setLastInstrInPredecessor = true;
    }

    GlobOptBlockData &predecessorBlockData = predecessor->globOptData;
    GlobOptBlockData &successorBlockData = successor->globOptData;
    struct DelayChangeValueInfo
    {
        Value* predecessorValue;
        ArrayValueInfo* valueInfo;
        void ChangeValueInfo(BasicBlock* predecessor, GlobOpt* g)
        {
            g->ChangeValueInfo(
                predecessor,
                predecessorValue,
                valueInfo,
                false /*allowIncompatibleType*/,
                true /*compensated*/);
        }
    };
    JsUtil::List<DelayChangeValueInfo, ArenaAllocator> delayChangeValueInfo(alloc);
    for(auto it = symsRequiringCompensationToMergedValueInfoMap->GetIterator(); it.IsValid(); it.MoveNext())
    {
        const auto &entry = it.Current();
        Sym *const sym = entry.Key();
        Value *const predecessorValue = predecessorBlockData.FindValue(sym);
        Assert(predecessorValue);
        ValueInfo *const predecessorValueInfo = predecessorValue->GetValueInfo();

        // Currently, array value infos are the only ones that require compensation based on values
        Assert(predecessorValueInfo->IsAnyOptimizedArray());
        const ArrayValueInfo *const predecessorArrayValueInfo = predecessorValueInfo->AsArrayValueInfo();
        StackSym *const predecessorHeadSegmentSym = predecessorArrayValueInfo->HeadSegmentSym();
        StackSym *const predecessorHeadSegmentLengthSym = predecessorArrayValueInfo->HeadSegmentLengthSym();
        StackSym *const predecessorLengthSym = predecessorArrayValueInfo->LengthSym();
        ValueInfo *const mergedValueInfo = entry.Value();
        const ArrayValueInfo *const mergedArrayValueInfo = mergedValueInfo->AsArrayValueInfo();
        StackSym *const mergedHeadSegmentSym = mergedArrayValueInfo->HeadSegmentSym();
        StackSym *const mergedHeadSegmentLengthSym = mergedArrayValueInfo->HeadSegmentLengthSym();
        StackSym *const mergedLengthSym = mergedArrayValueInfo->LengthSym();
        Assert(!mergedHeadSegmentSym || predecessorHeadSegmentSym);
        Assert(!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym);
        Assert(!mergedLengthSym || predecessorLengthSym);

        bool compensated = false;
        if(mergedHeadSegmentSym && predecessorHeadSegmentSym != mergedHeadSegmentSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_A,
                    IR::RegOpnd::New(mergedHeadSegmentSym, mergedHeadSegmentSym->GetType(), func),
                    IR::RegOpnd::New(predecessorHeadSegmentSym, predecessorHeadSegmentSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;
        }

        if(mergedHeadSegmentLengthSym && predecessorHeadSegmentLengthSym != mergedHeadSegmentLengthSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_A,
                    IR::RegOpnd::New(mergedHeadSegmentLengthSym, mergedHeadSegmentLengthSym->GetType(), func),
                    IR::RegOpnd::New(predecessorHeadSegmentLengthSym, predecessorHeadSegmentLengthSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;

            // Merge the head segment length value
            Assert(predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id));
            predecessorBlockData.liveVarSyms->Set(mergedHeadSegmentLengthSym->m_id);
            Value *const predecessorHeadSegmentLengthValue =
                predecessorBlockData.FindValue(predecessorHeadSegmentLengthSym);
            Assert(predecessorHeadSegmentLengthValue);
            predecessorBlockData.SetValue(predecessorHeadSegmentLengthValue, mergedHeadSegmentLengthSym);

            if (updateSuccessorBlockData)
            {
                successorBlockData.liveVarSyms->Set(mergedHeadSegmentLengthSym->m_id);
                Value *const mergedHeadSegmentLengthValue = successorBlockData.FindValue(mergedHeadSegmentLengthSym);
                if(mergedHeadSegmentLengthValue)
                {
                    Assert(mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber());
                    if(predecessorHeadSegmentLengthValue->GetValueInfo() != mergedHeadSegmentLengthValue->GetValueInfo())
                    {
                        mergedHeadSegmentLengthValue->SetValueInfo(
                            ValueInfo::MergeLikelyIntValueInfo(
                                this->alloc,
                                mergedHeadSegmentLengthValue,
                                predecessorHeadSegmentLengthValue,
                                mergedHeadSegmentLengthValue->GetValueInfo()->Type()
                                    .Merge(predecessorHeadSegmentLengthValue->GetValueInfo()->Type())));
                    }
                }
                else
                {
                    successorBlockData.SetValue(CopyValue(predecessorHeadSegmentLengthValue), mergedHeadSegmentLengthSym);
                }
            }
        }

        if(mergedLengthSym && predecessorLengthSym != mergedLengthSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_I4,
                    IR::RegOpnd::New(mergedLengthSym, mergedLengthSym->GetType(), func),
                    IR::RegOpnd::New(predecessorLengthSym, predecessorLengthSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;

            // Merge the length value
            Assert(predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id));
            predecessorBlockData.liveVarSyms->Set(mergedLengthSym->m_id);
            Value *const predecessorLengthValue = predecessorBlockData.FindValue(predecessorLengthSym);
            Assert(predecessorLengthValue);
            predecessorBlockData.SetValue(predecessorLengthValue, mergedLengthSym);

            if (updateSuccessorBlockData)
            {
                successorBlockData.liveVarSyms->Set(mergedLengthSym->m_id);
                Value *const mergedLengthValue = successorBlockData.FindValue(mergedLengthSym);
                if(mergedLengthValue)
                {
                    Assert(mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber());
                    if(predecessorLengthValue->GetValueInfo() != mergedLengthValue->GetValueInfo())
                    {
                        mergedLengthValue->SetValueInfo(
                            ValueInfo::MergeLikelyIntValueInfo(
                                this->alloc,
                                mergedLengthValue,
                                predecessorLengthValue,
                                mergedLengthValue->GetValueInfo()->Type().Merge(predecessorLengthValue->GetValueInfo()->Type())));
                    }
                }
                else
                {
                    successorBlockData.SetValue(CopyValue(predecessorLengthValue), mergedLengthSym);
                }
            }
        }

        if(compensated)
        {
            // Save the new ValueInfo for later.
            // We don't want other symbols needing compensation to see this new one
            delayChangeValueInfo.Add({
                predecessorValue,
                ArrayValueInfo::New(
                    alloc,
                    predecessorValueInfo->Type(),
                    mergedHeadSegmentSym ? mergedHeadSegmentSym : predecessorHeadSegmentSym,
                    mergedHeadSegmentLengthSym ? mergedHeadSegmentLengthSym : predecessorHeadSegmentLengthSym,
                    mergedLengthSym ? mergedLengthSym : predecessorLengthSym,
                    predecessorValueInfo->GetSymStore())
            });
        }
    }

    // Once we've compensated all the symbols, update the new ValueInfo.
    delayChangeValueInfo.Map([predecessor, this](int, DelayChangeValueInfo d) { d.ChangeValueInfo(predecessor, this); });

    if(setLastInstrInPredecessor)
    {
        predecessor->SetLastInstr(insertBeforeInstr->m_prev);
    }
}